

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

string * google::protobuf::internal::StringTypeHandler::New(Arena *arena,string *value)

{
  string *value_local;
  Arena *arena_local;
  string *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  
  if (arena == (Arena *)0x0) {
    local_30 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)local_30,(string *)value);
  }
  else {
    local_30 = (string *)
               Arena::AllocateAligned(arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    std::__cxx11::string::string((string *)local_30,(string *)value);
    Arena::AddListNode(arena,local_30,arena_destruct_object<std::__cxx11::string>);
  }
  return local_30;
}

Assistant:

static inline string* New(Arena* arena, string&& value) {
    return Arena::Create<string>(arena, std::move(value));
  }